

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clEnqueueCommandBufferKHR
                 (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_khr command_buffer,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  bool bVar3;
  cl_int errorCode;
  cl_int errorCode_00;
  CLdispatchX *pCVar4;
  time_point tVar5;
  time_point tVar6;
  bool bVar7;
  allocator local_d1;
  ulong local_d0;
  cl_uint local_c4;
  cl_command_queue local_c0;
  string queueList;
  cl_event *local_98;
  string local_90;
  time_point local_70;
  cl_event *local_68;
  time_point local_60;
  string eventWaitListString;
  cl_event local_event;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  local_c4 = num_events_in_wait_list;
  local_68 = event_wait_list;
  pCVar4 = CLIntercept::dispatchX(g_pIntercept,command_buffer);
  if (pCVar4->clEnqueueCommandBufferKHR ==
      (_func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    return -0x472;
  }
  local_d0 = CLIntercept::incrementEnqueueCounter(this);
  local_c0 = CLIntercept::getCommandBufferCommandQueue(this,num_queues,queues,command_buffer);
  if (((((this->m_Config).AubCapture == true) && ((this->m_Config).AubCaptureMinEnqueue <= local_d0)
       ) && (local_d0 <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueCommandBufferKHR",local_d0,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,local_c0);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00139436;
  queueList._M_dataplus._M_p = (pointer)&queueList.field_2;
  queueList._M_string_length = 0;
  eventWaitListString._M_dataplus._M_p = (pointer)&eventWaitListString.field_2;
  eventWaitListString._M_string_length = 0;
  queueList.field_2._M_local_buf[0] = '\0';
  eventWaitListString.field_2._M_local_buf[0] = '\0';
  bVar2 = (this->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CLIntercept::getObjectListString<_cl_command_queue*>(this,num_queues,queues,&queueList);
    getFormattedEventWaitList_abi_cxx11_(&local_90,this,local_c4,local_68);
    std::__cxx11::string::operator=((string *)&eventWaitListString,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = (this->m_Config).CallLogging;
  }
  if ((bVar2 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clEnqueueCommandBufferKHR",local_d0,(cl_kernel)0x0,
               "queues = %s, command_buffer = %p%s",queueList._M_dataplus._M_p,command_buffer,
               eventWaitListString._M_dataplus._M_p);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList(this,"clEnqueueCommandBufferKHR",local_c4,local_68,event);
  }
  local_event = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_60.__d.__r = (duration)0;
    bVar7 = false;
    local_98 = event;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar7 = event == (cl_event *)0x0;
    local_98 = event;
    if (bVar7) {
      local_98 = &local_event;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_70.__d.__r = (duration)0;
  }
  else {
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar4->clEnqueueCommandBufferKHR)
                        (num_queues,queues,command_buffer,local_c4,local_68,local_98);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar5.__d.__r = (duration)0;
  }
  else {
    tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_d0 &&
        (local_d0 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_90,"",&local_d1);
      CLIntercept::updateHostTimingStats(this,"clEnqueueCommandBufferKHR",&local_90,local_70,tVar5);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((local_98 != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00139241:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= local_d0) &&
         (local_d0 <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          std::__cxx11::string::string((string *)&local_90,"clEnqueueCommandBufferKHR",&local_d1);
          bVar3 = std::operator!=(&local_90,"clEnqueueUnmapMemObject");
          std::__cxx11::string::~string((string *)&local_90);
          if (!bVar3) goto LAB_001392f1;
        }
        std::__cxx11::string::string((string *)&local_90,"",&local_d1);
        CLIntercept::addTimingEvent
                  (this,"clEnqueueCommandBufferKHR",local_d0,local_60,&local_90,local_c0,*local_98);
        std::__cxx11::string::~string((string *)&local_90);
      }
LAB_001392f1:
      if (bVar7) {
        (*(this->m_Dispatch).clReleaseEvent)(*local_98);
        goto LAB_001392ff;
      }
    }
  }
  else {
    if (local_98 != (cl_event *)0x0) goto LAB_00139241;
LAB_001392ff:
    local_98 = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00139365;
    }
    else if (errorCode == 0) goto LAB_00139339;
LAB_0013934c:
    if ((bVar2 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueCommandBufferKHR",errorCode);
      bVar2 = (this->m_Config).ErrorAssert;
      goto LAB_0013934c;
    }
LAB_00139339:
    errorCode = 0;
  }
LAB_00139365:
  if (((local_98 != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*local_98 != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueCommandBufferKHR",errorCode,local_98,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_90,"",&local_d1);
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueCommandBufferKHR",&local_90,true,local_d0,local_70,tVar5);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (((local_98 != (cl_event *)0x0) && (*local_98 != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*local_98,local_d0);
  }
  std::__cxx11::string::~string((string *)&eventWaitListString);
  std::__cxx11::string::~string((string *)&queueList);
LAB_00139436:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar5.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueCommandBufferKHR");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(local_c0);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueCommandBufferKHR",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_d0 &&
          (local_d0 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&queueList,"",(allocator *)&eventWaitListString);
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&queueList,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&queueList);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&queueList,"",(allocator *)&eventWaitListString);
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&queueList,false,0,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&queueList);
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar5.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_d0 &&
          (local_d0 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&queueList,"",(allocator *)&eventWaitListString);
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&queueList,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&queueList);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&queueList,"",(allocator *)&eventWaitListString);
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&queueList,false,0,tVar5,tVar6);
        std::__cxx11::string::~string((string *)&queueList);
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_c0);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (local_d0 < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < local_d0)))) {
    CLIntercept::stopAubCapture(this,local_c0);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueCommandBufferKHR(
    cl_uint num_queues,
    cl_command_queue* queues,
    cl_command_buffer_khr command_buffer,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clEnqueueCommandBufferKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            COMMAND_BUFFER_GET_QUEUE( num_queues, queues, command_buffer );
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                std::string queueList;
                std::string eventWaitListString;
                if( pIntercept->config().CallLogging )
                {
                    pIntercept->getObjectListString(
                        num_queues,
                        queues,
                        queueList );
                    eventWaitListString = getFormattedEventWaitList(
                        pIntercept,
                        num_events_in_wait_list,
                        event_wait_list);
                }
                CALL_LOGGING_ENTER( "queues = %s, command_buffer = %p%s",
                    queueList.c_str(),
                    command_buffer,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueCommandBufferKHR(
                    num_queues,
                    queues,
                    command_buffer,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}